

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O0

void JSONWorker::DoNode(internalJSONNode *parent,json_string *value_t)

{
  char *pcVar1;
  ulong uVar2;
  allocator<char> local_151;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  json_string local_128;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  char *local_f8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  undefined4 local_e0;
  allocator<char> local_d9;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  json_string local_b0;
  size_t local_90;
  size_t name_starting;
  size_t value_ending;
  allocator<char> local_69;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  undefined1 local_40 [8];
  json_string name;
  size_t name_ending;
  json_string *value_t_local;
  internalJSONNode *parent_local;
  
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)value_t);
  if (*pcVar1 == '{') {
    uVar2 = std::__cxx11::string::length();
    if (2 < uVar2) {
      name.field_2._8_8_ = FindNextRelevant<(char)58>(value_t,1);
      if (name.field_2._8_8_ == 0xffffffffffffffff) {
        internalJSONNode::Nullify(parent);
      }
      else {
        local_50._M_current = (char *)std::__cxx11::string::begin();
        local_48 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+(&local_50,1);
        local_68._M_current = (char *)std::__cxx11::string::begin();
        local_60 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+(&local_68,name.field_2._8_8_);
        local_58 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator-(&local_60,1);
        std::allocator<char>::allocator();
        std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((string *)local_40,local_48,local_58,&local_69);
        std::allocator<char>::~allocator(&local_69);
        name_starting = FindNextRelevant<(char)44>(value_t,name.field_2._8_8_);
        local_90 = 1;
        while (name_starting != 0xffffffffffffffff) {
          local_c8._M_current = (char *)std::__cxx11::string::begin();
          local_c0 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(&local_c8,name.field_2._8_8_);
          local_b8 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(&local_c0,1);
          local_d8._M_current = (char *)std::__cxx11::string::begin();
          local_d0 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(&local_d8,name_starting);
          std::allocator<char>::allocator();
          std::__cxx11::string::
          string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                    ((string *)&local_b0,local_b8,local_d0,&local_d9);
          NewNode(parent,(json_string *)local_40,&local_b0,false);
          std::__cxx11::string::~string((string *)&local_b0);
          std::allocator<char>::~allocator(&local_d9);
          local_90 = name_starting + 1;
          name.field_2._8_8_ = FindNextRelevant<(char)58>(value_t,local_90);
          if (name.field_2._8_8_ == 0xffffffffffffffff) {
            internalJSONNode::Nullify(parent);
            local_e0 = 1;
            goto LAB_00159196;
          }
          local_f0._M_current = (char *)std::__cxx11::string::begin();
          local_e8 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(&local_f0,local_90);
          local_108._M_current = (char *)std::__cxx11::string::begin();
          local_100 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator+(&local_108,name.field_2._8_8_);
          local_f8 = (char *)__gnu_cxx::
                             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator-(&local_100,1);
          std::__cxx11::string::
          assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                    ((string *)local_40,local_e8,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_f8);
          name_starting = FindNextRelevant<(char)44>(value_t,name.field_2._8_8_);
        }
        local_140._M_current = (char *)std::__cxx11::string::begin();
        local_138 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator+(&local_140,name.field_2._8_8_);
        local_130 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator+(&local_138,1);
        local_150._M_current = (char *)std::__cxx11::string::end();
        local_148 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator-(&local_150,1);
        std::allocator<char>::allocator();
        std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((string *)&local_128,local_130,local_148,&local_151);
        NewNode(parent,(json_string *)local_40,&local_128,false);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator(&local_151);
        local_e0 = 0;
LAB_00159196:
        std::__cxx11::string::~string((string *)local_40);
      }
    }
  }
  else {
    internalJSONNode::Nullify(parent);
  }
  return;
}

Assistant:

void JSONWorker::DoNode(const internalJSONNode * parent, const json_string & value_t) json_nothrow {	
	//This take a node and creates its members and such
	JSON_ASSERT(!value_t.empty(), JSON_TEXT("DoNode is empty"));
	JSON_ASSERT_SAFE(value_t[0] == JSON_TEXT('{'), JSON_TEXT("DoNode is not an node"), parent -> Nullify(); return;);
	if (json_unlikely(value_t.length() <= 2)) return;  // just a {} (blank node)
	
	size_t name_ending = FIND_NEXT_RELEVANT(JSON_TEXT(':'), value_t, 1);  //find where the name ends
	JSON_ASSERT_SAFE(name_ending != json_string::npos, JSON_TEXT("Missing :"), parent -> Nullify(); return;);
	json_string name(value_t.begin() + 1, value_t.begin() + name_ending - 1);	  //pull the name out
	for (size_t value_ending = FIND_NEXT_RELEVANT(JSON_TEXT(','), value_t, name_ending),  //find the end of the value
		 name_starting = 1;  //ignore the {
		 value_ending != json_string::npos;
		 value_ending = FIND_NEXT_RELEVANT(JSON_TEXT(','), value_t, name_ending)){
		
		NewNode(parent, name, json_string(value_t.begin() + name_ending + 1, value_t.begin() + value_ending), false);
		name_starting = value_ending + 1;
		name_ending = FIND_NEXT_RELEVANT(JSON_TEXT(':'), value_t, name_starting);
		JSON_ASSERT_SAFE(name_ending != json_string::npos, JSON_TEXT("Missing :"), parent -> Nullify(); return;);
		name.assign(value_t.begin() + name_starting, value_t.begin() + name_ending - 1);
	}
	//since the last one will not find the comma, we have to add it here
	NewNode(parent, name, json_string(value_t.begin() + name_ending + 1, value_t.end() - 1), false);
}